

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

string * cmGeneratorExpressionNode::EvaluateDependentExpression
                   (string *__return_storage_ptr__,string *prop,cmLocalGenerator *lg,
                   cmGeneratorExpressionContext *context,cmGeneratorTarget *headTarget,
                   cmGeneratorTarget *currentTarget,cmGeneratorExpressionDAGChecker *dagChecker)

{
  undefined8 uVar1;
  char *pcVar2;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  undefined1 local_60 [16];
  cmGeneratorExpression ge;
  
  local_60._8_8_ = __return_storage_ptr__;
  cmGeneratorExpression::cmGeneratorExpression(&ge,&context->Backtrace);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_60,(string *)&ge);
  uVar1 = local_60._0_8_;
  local_60._0_8_ = (cmState *)0x0;
  cge.x_ = (cmCompiledGeneratorExpression *)uVar1;
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_60);
  *(bool *)(uVar1 + 0x178) = context->EvaluateForBuildsystem;
  pcVar2 = cmCompiledGeneratorExpression::Evaluate
                     ((cmCompiledGeneratorExpression *)uVar1,lg,&context->Config,context->Quiet,
                      headTarget,currentTarget,dagChecker,&context->Language);
  uVar1 = local_60._8_8_;
  std::__cxx11::string::string((string *)local_60._8_8_,pcVar2,(allocator *)local_60);
  if ((cge.x_)->HadContextSensitiveCondition == true) {
    context->HadContextSensitiveCondition = true;
  }
  if ((cge.x_)->HadHeadSensitiveCondition == true) {
    context->HadHeadSensitiveCondition = true;
  }
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return (string *)(cmLinkedTree<cmStateDetail::SnapshotDataType> *)uVar1;
}

Assistant:

std::string cmGeneratorExpressionNode::EvaluateDependentExpression(
  std::string const& prop, cmLocalGenerator* lg,
  cmGeneratorExpressionContext* context, cmGeneratorTarget const* headTarget,
  cmGeneratorTarget const* currentTarget,
  cmGeneratorExpressionDAGChecker* dagChecker)
{
  cmGeneratorExpression ge(context->Backtrace);
  CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(prop);
  cge->SetEvaluateForBuildsystem(context->EvaluateForBuildsystem);
  std::string result =
    cge->Evaluate(lg, context->Config, context->Quiet, headTarget,
                  currentTarget, dagChecker, context->Language);
  if (cge->GetHadContextSensitiveCondition()) {
    context->HadContextSensitiveCondition = true;
  }
  if (cge->GetHadHeadSensitiveCondition()) {
    context->HadHeadSensitiveCondition = true;
  }
  return result;
}